

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O0

uint16_t * __thiscall
anon_unknown.dwarf_e304c3::
AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
::RandomInput16(AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
                *this,uint16_t *p,
               TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
               *param)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  BlockSize *pBVar4;
  TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
  *in_RDX;
  long in_RSI;
  char *in_RDI;
  int padded_height;
  int padded_width;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  bool *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  uint16_t *in_stack_ffffffffffffff18;
  AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
  *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 uVar5;
  Type in_stack_ffffffffffffff3c;
  AssertHelper *in_stack_ffffffffffffff40;
  AssertionResult local_a8;
  char *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffff88;
  AssertHelper *in_stack_ffffffffffffff90;
  AssertionResult local_28;
  TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
  *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  iVar2 = TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
          ::BitDepth(in_RDX);
  uVar5 = true;
  if (iVar2 != 10) {
    iVar2 = TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
            ::BitDepth(local_18);
    uVar5 = iVar2 == 0xc;
  }
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff08,(type *)0x96c853);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)in_stack_ffffffffffffff88._M_head_impl,in_stack_ffffffffffffff80,
               (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff70);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
               (char *)CONCAT17(uVar5,in_stack_ffffffffffffff30),(int)((ulong)in_RDI >> 0x20),
               (char *)in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff90,(Message *)in_stack_ffffffffffffff88._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
    testing::Message::~Message((Message *)0x96c914);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x96c9a8);
  pBVar4 = TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
           ::Block(local_18);
  BlockSize::Width(pBVar4);
  testing::internal::CmpHelperGE<int,int>
            (in_RDI,(char *)in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18,
             (int *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff80);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff20 =
         (AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
          *)testing::AssertionResult::failure_message((AssertionResult *)0x96ca28);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
               (char *)CONCAT17(uVar5,in_stack_ffffffffffffff30),(int)((ulong)in_RDI >> 0x20),
               (char *)in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff90,(Message *)in_stack_ffffffffffffff88._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    testing::Message::~Message((Message *)0x96ca76);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x96cadb);
  pBVar4 = TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
           ::Block(local_18);
  BlockSize::Height(pBVar4);
  testing::internal::CmpHelperGE<int,int>
            (in_RDI,(char *)in_stack_ffffffffffffff20,(int *)in_stack_ffffffffffffff18,
             (int *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  iVar2 = (int)((ulong)in_RDI >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff18 =
         (uint16_t *)testing::AssertionResult::failure_message((AssertionResult *)0x96cb58);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
               (char *)CONCAT17(uVar5,in_stack_ffffffffffffff30),iVar2,
               (char *)in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff90,(Message *)in_stack_ffffffffffffff88._M_head_impl);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    testing::Message::~Message((Message *)0x96cba6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x96cc0e);
  pBVar4 = TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
           ::Block(local_18);
  iVar2 = BlockSize::Width(pBVar4);
  iVar2 = iVar2 + 0xc;
  pBVar4 = TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
           ::Block(local_18);
  iVar3 = BlockSize::Height(pBVar4);
  iVar3 = iVar2 * (iVar3 + 0xc);
  TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*,_int)>
  ::BitDepth(local_18);
  Randomize(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,iVar3,in_stack_ffffffffffffff10);
  return (uint16_t *)(local_10 + (long)(iVar2 * 6) * 2 + 0xc);
}

Assistant:

const uint16_t *RandomInput16(uint16_t *p, const TestParam<T> &param) {
    // Check that this is only called with high bit-depths.
    EXPECT_TRUE(param.BitDepth() == 10 || param.BitDepth() == 12);
    EXPECT_GE(MAX_SB_SIZE, param.Block().Width());
    EXPECT_GE(MAX_SB_SIZE, param.Block().Height());
    const int padded_width = param.Block().Width() + kInputPadding;
    const int padded_height = param.Block().Height() + kInputPadding;
    Randomize(p, padded_width * padded_height, param.BitDepth());
    return p + (kInputPadding / 2) * padded_width + kInputPadding / 2;
  }